

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::EnumDef::SortByValue(EnumDef *this)

{
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *this_00;
  iterator iVar2;
  iterator iVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *v;
  EnumDef *this_local;
  
  this_00 = &(this->vals).vec;
  bVar1 = IsUInt64(this);
  if (bVar1) {
    iVar2 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                      (this_00);
    iVar3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                      (this_00);
    std::
    sort<__gnu_cxx::__normal_iterator<flatbuffers::EnumVal**,std::vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>>>,flatbuffers::EnumDef::SortByValue()::__0>
              (iVar2._M_current,iVar3._M_current);
  }
  else {
    iVar2 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                      (this_00);
    iVar3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                      (this_00);
    std::
    sort<__gnu_cxx::__normal_iterator<flatbuffers::EnumVal**,std::vector<flatbuffers::EnumVal*,std::allocator<flatbuffers::EnumVal*>>>,flatbuffers::EnumDef::SortByValue()::__1>
              (iVar2._M_current,iVar3._M_current);
  }
  return;
}

Assistant:

void EnumDef::SortByValue() {
  auto &v = vals.vec;
  if (IsUInt64())
    std::sort(v.begin(), v.end(), [](const EnumVal *e1, const EnumVal *e2) {
      if (e1->GetAsUInt64() == e2->GetAsUInt64()) {
        return e1->name < e2->name;
      }
      return e1->GetAsUInt64() < e2->GetAsUInt64();
    });
  else
    std::sort(v.begin(), v.end(), [](const EnumVal *e1, const EnumVal *e2) {
      if (e1->GetAsInt64() == e2->GetAsInt64()) { return e1->name < e2->name; }
      return e1->GetAsInt64() < e2->GetAsInt64();
    });
}